

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O3

Vec_Wec_t * Gia_Iso2ManCheckIsoClasses(Gia_Man_t *p,Vec_Wec_t *vEquivs)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *vRoots;
  int *piVar3;
  Vec_Int_t *vVec0;
  Vec_Int_t *vVec1;
  Vec_Int_t *vMap0;
  Vec_Int_t *vMap1;
  int *__s;
  Vec_Int_t *vNewClass;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  vRoots = (Vec_Int_t *)malloc(0x10);
  vRoots->nCap = 10000;
  vRoots->nSize = 0;
  piVar3 = (int *)malloc(40000);
  vRoots->pArray = piVar3;
  vVec0 = (Vec_Int_t *)malloc(0x10);
  vVec0->nCap = 10000;
  vVec0->nSize = 0;
  piVar3 = (int *)malloc(40000);
  vVec0->pArray = piVar3;
  vVec1 = (Vec_Int_t *)malloc(0x10);
  vVec1->nCap = 10000;
  vVec1->nSize = 0;
  piVar3 = (int *)malloc(40000);
  vVec1->pArray = piVar3;
  iVar1 = p->nObjs;
  vMap0 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  vMap0->nCap = iVar6;
  if (iVar6 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar6 * 4);
  }
  vMap0->pArray = piVar3;
  vMap0->nSize = iVar1;
  __s = (int *)0x0;
  memset(piVar3,0,(long)iVar1 << 2);
  vMap1 = (Vec_Int_t *)malloc(0x10);
  vMap1->nCap = iVar6;
  if (iVar6 != 0) {
    __s = (int *)malloc((long)iVar6 << 2);
  }
  vMap1->pArray = __s;
  vMap1->nSize = iVar1;
  pVVar4 = (Vec_Int_t *)0x0;
  memset(__s,0,(long)iVar1 << 2);
  vNewClass = (Vec_Int_t *)malloc(0x10);
  vNewClass->nCap = 100;
  vNewClass->nSize = 0;
  piVar3 = (int *)malloc(400);
  vNewClass->pArray = piVar3;
  iVar1 = vEquivs->nSize;
  p_00 = (Vec_Wec_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar1 * 2 - 1U) {
    iVar6 = iVar1 * 2;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar6;
  if (iVar6 != 0) {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar6,0x10);
  }
  p_00->pArray = pVVar4;
  if (0 < iVar1) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      pVVar4 = vEquivs->pArray + lVar8;
      uVar2 = (int)lVar8 * -0x3d70a3d7;
      if ((uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f) < 0x51eb852) {
        printf("Finished %8d outputs (out of %8d)...\r",uVar7,
               (ulong)(uint)(p->vCos->nSize - p->nRegs));
        fflush(_stdout);
      }
      Gia_Iso2ManCheckIsoClassOne(p,pVVar4,vRoots,vVec0,vVec1,vMap0,vMap1,vNewClass);
      uVar7 = (ulong)(uint)((int)uVar7 + pVVar4->nSize);
      pVVar5 = Vec_WecPushLevel(p_00);
      iVar1 = pVVar4->nSize;
      piVar3 = pVVar4->pArray;
      pVVar5->nCap = pVVar4->nCap;
      pVVar5->nSize = iVar1;
      pVVar5->pArray = piVar3;
      pVVar4->nCap = 0;
      pVVar4->nSize = 0;
      pVVar4->pArray = (int *)0x0;
      uVar2 = vNewClass->nSize;
      if ((ulong)uVar2 != 0) {
        pVVar4 = Vec_WecPushLevel(vEquivs);
        if (0 < (int)uVar2) {
          piVar3 = vNewClass->pArray;
          uVar9 = 0;
          do {
            Vec_IntPush(pVVar4,piVar3[uVar9]);
            uVar9 = uVar9 + 1;
          } while (uVar2 != uVar9);
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vEquivs->nSize);
    piVar3 = vNewClass->pArray;
  }
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(vNewClass);
  if (vRoots->pArray != (int *)0x0) {
    free(vRoots->pArray);
  }
  free(vRoots);
  if (vVec0->pArray != (int *)0x0) {
    free(vVec0->pArray);
  }
  free(vVec0);
  if (vVec1->pArray != (int *)0x0) {
    free(vVec1->pArray);
  }
  free(vVec1);
  if (vMap0->pArray != (int *)0x0) {
    free(vMap0->pArray);
  }
  free(vMap0);
  if (vMap1->pArray != (int *)0x0) {
    free(vMap1->pArray);
  }
  free(vMap1);
  return p_00;
}

Assistant:

Vec_Wec_t * Gia_Iso2ManCheckIsoClasses( Gia_Man_t * p, Vec_Wec_t * vEquivs )
{
    Vec_Wec_t * vEquivs2;
    Vec_Int_t * vRoots = Vec_IntAlloc( 10000 );
    Vec_Int_t * vVec0 = Vec_IntAlloc( 10000 );
    Vec_Int_t * vVec1 = Vec_IntAlloc( 10000 );
    Vec_Int_t * vMap0 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vMap1 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vClass, * vClass2, * vNewClass;
    int i, Counter = 0;
    vNewClass = Vec_IntAlloc( 100 );
    vEquivs2 = Vec_WecAlloc( 2 * Vec_WecSize(vEquivs) );
    Vec_WecForEachLevel( vEquivs, vClass, i )
    {
        if ( i % 50 == 0 )
            printf( "Finished %8d outputs (out of %8d)...\r", Counter, Gia_ManPoNum(p) ), fflush(stdout);
        // split this class
        Gia_Iso2ManCheckIsoClassOne( p, vClass, vRoots, vVec0, vVec1, vMap0, vMap1, vNewClass );
        Counter += Vec_IntSize(vClass);
        // add remaining class
        vClass2 = Vec_WecPushLevel( vEquivs2 );
        *vClass2 = *vClass;
        vClass->pArray = NULL;
        vClass->nSize = vClass->nCap = 0;
        // add new class
        if ( Vec_IntSize(vNewClass) == 0 )
            continue;
        vClass = Vec_WecPushLevel( vEquivs );
        Vec_IntAppend( vClass, vNewClass );
    }
    Vec_IntFree( vNewClass );   
    Vec_IntFree( vRoots );
    Vec_IntFree( vVec0 );
    Vec_IntFree( vVec1 );
    Vec_IntFree( vMap0 );
    Vec_IntFree( vMap1 );
    return vEquivs2;
}